

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::releaseAndDetachTextureObject
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,GLuint texture_id,
          bool is_color_attachment)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  GLenum attachment;
  bool is_color_attachment_local;
  TextureCubeMapArrayColorDepthAttachmentsTest *pTStack_10;
  GLuint texture_id_local;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_local;
  long lVar4;
  
  attachment = texture_id;
  pTStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (is_color_attachment) {
    gl._4_4_ = 0x8ce0;
  }
  else {
    gl._4_4_ = 0x8d00;
  }
  (**(code **)(lVar4 + 0x78))(0x8ca9,this->m_framebuffer_object_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x317);
  (**(code **)(lVar4 + 0x6a0))(0x8ca9,gl._4_4_,0xde1,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glFramebufferTexture2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x31c);
  (**(code **)(lVar4 + 0xb8))(0x9009,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,800);
  (**(code **)(lVar4 + 0x480))(1,&attachment);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDeleteTextures() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x324);
  return;
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::releaseAndDetachTextureObject(glw::GLuint texture_id,
																				 bool		 is_color_attachment)
{
	glw::GLenum			  attachment = GL_NONE;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	if (true == is_color_attachment)
	{
		attachment = GL_COLOR_ATTACHMENT0;
	}
	else
	{
		attachment = GL_DEPTH_ATTACHMENT;
	}

	/* Update draw framewbuffer binding just in case. */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	/* Clean framebuffer's attachment */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, attachment, GL_TEXTURE_2D, 0, /* texture */
							0);												   /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Unbind the texture object from GL_TEXTURE_CUBE_MAP_ARRAY binding point */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* Finally delete the texture object */
	gl.deleteTextures(1, &texture_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");
}